

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void __thiscall
gnuplotio::PlotData::
PlotData<std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,gnuplotio::Mode2D,gnuplotio::ModeText>
          (PlotData *this,undefined8 *arg,long *_plotspec,long *_arr_or_rec)

{
  ostringstream tmp;
  undefined4 *local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  string *local_1b8;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = &(this->plotspec).field_2;
  (this->plotspec)._M_dataplus._M_p = (pointer)local_1c0;
  std::__cxx11::string::_M_construct<char*>((string *)this,*_plotspec,_plotspec[1] + *_plotspec);
  this->is_text = true;
  this->is_inline = true;
  this->has_data = true;
  local_1c8 = &(this->data).field_2;
  (this->data)._M_dataplus._M_p = (pointer)local_1c8;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  local_1d0 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_1d0;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  local_1b8 = &this->arr_or_rec;
  local_1d8 = &(this->arr_or_rec).field_2;
  (this->arr_or_rec)._M_dataplus._M_p = (pointer)local_1d8;
  local_1b0 = &this->data;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,*_arr_or_rec,_arr_or_rec[1] + *_arr_or_rec);
  (this->bin_fmt)._M_dataplus._M_p = (pointer)&(this->bin_fmt).field_2;
  (this->bin_fmt)._M_string_length = 0;
  (this->bin_fmt).field_2._M_local_buf[0] = '\0';
  (this->bin_size)._M_dataplus._M_p = (pointer)&(this->bin_size).field_2;
  (this->bin_size)._M_string_length = 0;
  (this->bin_size).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f8 = (undefined4 *)*arg;
  uStack_1f0 = arg[1];
  local_1e8 = *(undefined4 *)(arg + 3);
  uStack_1e4 = *(undefined4 *)((long)arg + 0x1c);
  uStack_1e0 = *(undefined4 *)(arg + 4);
  uStack_1dc = *(undefined4 *)((long)arg + 0x24);
  print_block<2ul,gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>const*,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>,gnuplotio::ModeText>
            (local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->data,(string *)&local_1f8);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT44(uStack_1e4,local_1e8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->is_text == false) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    local_1f8 = (undefined4 *)*arg;
    uStack_1f0 = arg[1];
    local_1e8 = *(undefined4 *)(arg + 3);
    uStack_1e4 = *(undefined4 *)((long)arg + 0x1c);
    uStack_1e0 = *(undefined4 *)(arg + 4);
    uStack_1dc = *(undefined4 *)((long)arg + 0x24);
    print_block<2ul,gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>const*,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>,gnuplotio::ModeBinfmt>
              (local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_fmt,(string *)&local_1f8);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,CONCAT44(uStack_1e4,local_1e8) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    local_1f8 = (undefined4 *)*arg;
    uStack_1f0 = arg[1];
    local_1e8 = *(undefined4 *)(arg + 3);
    uStack_1e4 = *(undefined4 *)((long)arg + 0x1c);
    uStack_1e0 = *(undefined4 *)(arg + 4);
    uStack_1dc = *(undefined4 *)((long)arg + 0x24);
    print_block<2ul,gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>const*,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>,gnuplotio::ModeSize>
              (local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_size,(string *)&local_1f8);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,CONCAT44(uStack_1e4,local_1e8) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

PlotData(
        const T &arg,
        const std::string &_plotspec,
        const std::string &_arr_or_rec,
        OrganizationMode, PrintMode
    ) :
        plotspec(_plotspec),
        is_text(PrintMode::is_text),
        is_inline(true),
        has_data(true),
        arr_or_rec(_arr_or_rec)
    {
        {
            std::ostringstream tmp;
            top_level_array_sender(tmp, arg, OrganizationMode(), PrintMode());
            data = tmp.str();
        }

        if(!is_text) {
            try {
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
                    bin_fmt = tmp.str();
                }
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
                    bin_size = tmp.str();
                }
            } catch(const plotting_empty_container &) {
                bin_fmt = "";
                bin_size = "0";
            }
        }
    }